

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O1

int coda_type_get_record_field_type(coda_type *type,long index,coda_type **field_type)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (type == (coda_type *)0x0) {
    pcVar2 = "type argument is NULL (%s:%u)";
    uVar1 = 0xd26;
LAB_00137262:
    coda_set_error(-100,pcVar2,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                   ,uVar1);
  }
  else {
    switch(type->type_class) {
    case coda_record_class:
      if (field_type != (coda_type **)0x0) {
        if ((-1 < index) && (index < (long)type[1].name)) {
          *field_type = *(coda_type **)(*(long *)(type[1].description + index * 8) + 0x10);
          return 0;
        }
        coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld) (%s:%u)",index,
                       type[1].name,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-type.c"
                       ,0xd38);
        return -1;
      }
      pcVar2 = "field_type argument is NULL (%s:%u)";
      uVar1 = 0xd31;
      goto LAB_00137262;
    case coda_array_class:
      pcVar2 = "array";
      break;
    case coda_integer_class:
      pcVar2 = "integer";
      break;
    case coda_real_class:
      pcVar2 = "real";
      break;
    case coda_text_class:
      pcVar2 = "text";
      break;
    case coda_raw_class:
      pcVar2 = "raw";
      break;
    case coda_special_class:
      pcVar2 = "special";
      break;
    default:
      pcVar2 = "unknown";
    }
    coda_set_error(-0x69,"type does not refer to a record (current type is %s)",pcVar2);
  }
  return -1;
}

Assistant:

LIBCODA_API int coda_type_get_record_field_type(const coda_type *type, long index, coda_type **field_type)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->type_class != coda_record_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "type does not refer to a record (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    if (field_type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "field_type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (index < 0 || index >= ((coda_type_record *)type)->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld) (%s:%u)", index,
                       ((coda_type_record *)type)->num_fields, __FILE__, __LINE__);
        return -1;
    }
    *field_type = ((coda_type_record *)type)->field[index]->type;
    return 0;
}